

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawSubClampColumnP_C(void)

{
  int iVar1;
  lighttable_t *plVar2;
  fixed_t fVar3;
  DWORD *pDVar4;
  DWORD *pDVar5;
  BYTE *pBVar6;
  uint uVar7;
  uint uVar8;
  DWORD b;
  DWORD a;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int pitch;
  BYTE *source;
  BYTE *colormap;
  fixed_t fracstep;
  fixed_t frac;
  BYTE *dest;
  int count;
  
  pBVar6 = dc_source;
  pDVar5 = dc_destblend;
  pDVar4 = dc_srcblend;
  fVar3 = dc_iscale;
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  dest._4_4_ = dc_count;
  if (0 < dc_count) {
    _fracstep = dc_dest;
    colormap._4_4_ = dc_texturefrac;
    do {
      uVar7 = (pDVar4[plVar2[pBVar6[colormap._4_4_ >> 0x10]]] | 0x40100400) - pDVar5[*_fracstep];
      uVar8 = uVar7 & 0x40100400;
      uVar7 = uVar8 - (uVar8 >> 5) & uVar7 | 0x1f07c1f;
      *_fracstep = RGB32k.All[uVar7 & uVar7 >> 0xf];
      _fracstep = _fracstep + iVar1;
      colormap._4_4_ = fVar3 + colormap._4_4_;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void R_DrawSubClampColumnP_C ()
{
	int count;
	BYTE *dest;
	fixed_t frac;
	fixed_t fracstep;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;

	fracstep = dc_iscale;
	frac = dc_texturefrac;

	{
		BYTE *colormap = dc_colormap;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;
		DWORD *fg2rgb = dc_srcblend;
		DWORD *bg2rgb = dc_destblend;

		do
		{
			DWORD a = (fg2rgb[colormap[source[frac>>FRACBITS]]] | 0x40100400) - bg2rgb[*dest];
			DWORD b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[a & (a>>15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}
}